

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

bool __thiscall
Reducer::shrinkByReduction<wasm::DataSegment>(Reducer *this,DataSegment *segment,size_t bonus)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auStack_58 [8];
  vector<char,_std::allocator<char>_> save;
  
  if ((segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 1;
    bVar2 = false;
    uVar8 = 0;
    do {
      if ((bVar2) || (bVar2 = shouldTryToReduce(this,bonus), bVar2)) {
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)auStack_58,&segment->data);
        if (uVar7 != 0) {
          pcVar1 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar5 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar6 = uVar7;
          do {
            if (pcVar5 == pcVar1) break;
            pcVar5 = pcVar5 + -1;
            (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar5;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        bVar3 = writeAndTestReduction(this);
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"|      shrank segment from ",0x1b);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," => ",4);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," (skip: ",8);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
          this->reduced = this->reduced + 1;
          applyTestToWorking(this);
          uVar7 = uVar7 * 2;
          if ((ulong)(long)this->factor <= uVar7) {
            uVar7 = (long)this->factor;
          }
        }
        else {
          pcVar1 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar5 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)auStack_58;
          (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               save.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
          (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               save.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          auStack_58 = (undefined1  [8])0x0;
          save.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          save.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          if (pcVar1 == (pointer)0x0) {
            return false;
          }
          operator_delete(pcVar1,(long)pcVar5 - (long)pcVar1);
        }
        if (auStack_58 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_58,
                          (long)save.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)auStack_58);
        }
        bVar2 = true;
        if (!bVar3) {
          return false;
        }
      }
      else {
        bVar2 = false;
      }
      pcVar1 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar5 = (segment->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((pcVar1 != pcVar5) && (uVar8 = uVar8 + 1, uVar8 < (ulong)((long)pcVar1 - (long)pcVar5))
            );
  }
  return true;
}

Assistant:

bool shrinkByReduction(T* segment, size_t bonus) {
    // try to reduce to first function. first, shrink segment elements.
    // while we are shrinking successfully, keep going exponentially.
    bool justShrank = false;

    auto& data = segment->data;
    // when we succeed, try to shrink by more and more, similar to bisection
    size_t skip = 1;
    for (size_t i = 0; i < data.size() && !data.empty(); i++) {
      if (justShrank || shouldTryToReduce(bonus)) {
        auto save = data;
        for (size_t j = 0; j < skip; j++) {
          if (data.empty()) {
            break;
          } else {
            data.pop_back();
          }
        }
        justShrank = writeAndTestReduction();
        if (justShrank) {
          std::cerr << "|      shrank segment from " << save.size() << " => "
                    << data.size() << " (skip: " << skip << ")\n";
          noteReduction();
          skip = std::min(size_t(factor), 2 * skip);
        } else {
          data = std::move(save);
          return false;
        }
      }
    }

    return true;
  }